

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.hpp
# Opt level: O0

void make_timelapse(vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list,arguments *args)

{
  int iVar1;
  byte bVar2;
  undefined4 uVar3;
  ostream *poVar4;
  undefined8 extraout_RAX;
  size_type sVar5;
  reference pvVar6;
  int local_74;
  int i;
  int total;
  Size_<int> local_60;
  VideoWriter local_58 [8];
  VideoWriter outputVideo;
  Size_<int> local_2c;
  Size S;
  int w;
  int h;
  int codec;
  arguments *args_local;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *image_list_local;
  
  poVar4 = std::operator<<((ostream *)&std::cout,(string *)color::blue_abi_cxx11_);
  poVar4 = std::operator<<(poVar4," Timelapse in progress ");
  poVar4 = std::operator<<(poVar4,(string *)color::reset_abi_cxx11_);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar3 = cv::VideoWriter::fourcc('H','2','6','4');
  S.height = 0;
  S.width = 0;
  CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[](image_list,0);
  cv::MatSize::operator()((MatSize *)&local_2c);
  cv::VideoWriter::VideoWriter(local_58);
  iVar1 = args->frames;
  cv::Size_<int>::Size_(&local_60,&local_2c);
  cv::VideoWriter::open((double)iVar1,local_58,&args->output_file_name,uVar3,&local_60,1);
  bVar2 = cv::VideoWriter::isOpened();
  if ((bVar2 & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)color::red_abi_cxx11_);
    poVar4 = std::operator<<(poVar4,"Could not open the output video for write ");
    poVar4 = std::operator<<(poVar4,(string *)color::reset_abi_cxx11_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    _Exit(0);
    cv::VideoWriter::~VideoWriter(local_58);
    _Unwind_Resume(extraout_RAX);
  }
  sVar5 = CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::size(image_list);
  for (local_74 = 0; local_74 < (int)sVar5; local_74 = local_74 + 1) {
    pvVar6 = CLI::std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                       (image_list,(long)local_74);
    cv::VideoWriter::operator<<(local_58,pvVar6);
    progress_bar(local_74,(int)sVar5);
  }
  cv::VideoWriter::~VideoWriter(local_58);
  return;
}

Assistant:

void make_timelapse(vector<cv::Mat> image_list, arguments args)
{
    cout<< color::blue << " Timelapse in progress "<<color::reset<<endl;
    int codec = VideoWriter::fourcc('H', '2', '6', '4');
    int h = 0, w = 0;
    Size S = image_list[0].size();
    VideoWriter outputVideo;
    outputVideo.open(args.output_file_name, codec, args.frames, S, true);

    if (!outputVideo.isOpened())
    {
        std::cout<< color::red << "Could not open the output video for write " << color::reset << std::endl;
        _Exit(0);
    }

    // frames to video
    int total = image_list.size();
    for (int i = 0; i < total; i++)
    {
        outputVideo << image_list[i];
        progress_bar(i, total);
    }
}